

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O2

bool nv::ImageIO::saveFloat
               (char *fileName,FloatImage *fimage,uint base_component,uint num_components)

{
  bool bVar1;
  int iVar2;
  AutoPtr<nv::Image> image;
  
  Path::extension(fileName);
  if (num_components - 3 < 2) {
    image.m_ptr = FloatImage::createImage(fimage,base_component,num_components);
    if (image.m_ptr == (Image *)0x0) {
      iVar2 = nvAbort("image != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,199,
                      "bool nv::ImageIO::saveFloat(const char *, const FloatImage *, uint, uint)");
      if (iVar2 == 1) {
        raise(5);
      }
    }
    if (num_components == 4) {
      Image::setFormat(image.m_ptr,Format_ARGB);
    }
    bVar1 = save(fileName,image.m_ptr);
    AutoPtr<nv::Image>::~AutoPtr(&image);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool nv::ImageIO::saveFloat(const char * fileName, const FloatImage * fimage, uint base_component, uint num_components)
{
	const char * extension = Path::extension(fileName);

#if defined(HAVE_OPENEXR)
	if (strCaseCmp(extension, ".exr") == 0)
	{
		return ImageIO::saveFloatEXR(fileName, fimage, base_component, num_components);
	}
#endif

#if defined(HAVE_TIFF)
	if (strCaseCmp(extension, ".tif") == 0 || strCaseCmp(extension, ".tiff") == 0)
	{
		return ImageIO::saveFloatTIFF(fileName, fimage, base_component, num_components);
	}
#endif

/* // @@ Disable Temporarily
	if (strCaseCmp(extension, ".pfm") == 0)
	{
//		return ImageIO::saveFloatPFM(fileName, fimage, base_component, num_components);
	}
*/

	if (num_components == 3 || num_components == 4)
	{
		AutoPtr<Image> image(fimage->createImage(base_component, num_components));
		nvCheck(image != NULL);

		if (num_components == 4)
		{
			image->setFormat(Image::Format_ARGB);
		}

		return ImageIO::save(fileName, image.ptr());
	}

	return false;
}